

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O0

void __thiscall Mapper004::Mapper004(Mapper004 *this,FileHeader *_header)

{
  uint32_t uVar1;
  Console *this_00;
  PPU *this_01;
  FileHeader *in_RSI;
  Mapper004 *in_RDI;
  Console *c;
  
  IMapper::IMapper(&in_RDI->super_IMapper);
  (in_RDI->super_IMapper)._vptr_IMapper = (_func_int **)&PTR_execute_00127b50;
  in_RDI->irqEnabled = false;
  in_RDI->reloadVal = '\0';
  in_RDI->counter = '\0';
  in_RDI->params = in_RSI;
  this_00 = Console::Instance();
  this_01 = Console::getPPU(this_00);
  PPU::setMirroring(this_01,in_RSI->flagsPPUDetails & 1);
  uVar1 = calcRBankOffset(in_RDI,'\0');
  in_RDI->ROMBanks[0] = uVar1;
  uVar1 = calcRBankOffset(in_RDI,'\x01');
  in_RDI->ROMBanks[1] = uVar1;
  uVar1 = calcRBankOffset(in_RDI,0xfe);
  in_RDI->ROMBanks[2] = uVar1;
  uVar1 = calcRBankOffset(in_RDI,0xff);
  in_RDI->ROMBanks[3] = uVar1;
  memset(in_RDI->regs,0,8);
  return;
}

Assistant:

Mapper004::Mapper004(struct FileHeader *_header) {
    params = _header;
    Console &c = Console::Instance();
    c.getPPU()->setMirroring(_header->flagsPPUDetails & 1);
    ROMBanks[0] = calcRBankOffset(0);
    ROMBanks[1] = calcRBankOffset(1);
    ROMBanks[2] = calcRBankOffset(-2);
    ROMBanks[3] = calcRBankOffset(-1);
    memset(regs, 0x00, sizeof(regs));
}